

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

int AF_AActor_ResolveState
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int pos;
  undefined8 *puVar1;
  PClass *pPVar2;
  undefined8 uVar3;
  PClass *pPVar4;
  FState *val;
  char *pcVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (0 < numparam) {
    if (((param->field_0).field_3.Type != '\x03') ||
       (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_004578a7:
      pcVar5 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_004578fa;
    }
    puVar1 = (undefined8 *)(param->field_0).field_1.a;
    if (puVar1 != (undefined8 *)0x0) {
      if (puVar1[1] == 0) {
        uVar3 = (**(code **)*puVar1)(puVar1);
        puVar1[1] = uVar3;
      }
      pPVar4 = (PClass *)puVar1[1];
      bVar7 = pPVar4 == (PClass *)0x0;
      bVar8 = !bVar7;
      defaultparam = (TArray<VMValue,_VMValue> *)(ulong)(pPVar4 == pPVar2 || bVar7);
      if (pPVar4 != pPVar2 && !bVar7) {
        do {
          pPVar4 = pPVar4->ParentClass;
          bVar8 = pPVar4 != (PClass *)0x0;
          if (pPVar4 == pPVar2) break;
        } while (pPVar4 != (PClass *)0x0);
      }
      if (!bVar8) {
        pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_004578fa;
      }
    }
    pPVar2 = AActor::RegistrationInfo.MyClass;
    if (numparam != 1) {
      if ((param[1].field_0.field_3.Type != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_004578a7;
      puVar1 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar1 != (undefined8 *)0x0) {
        if (puVar1[1] == 0) {
          uVar3 = (**(code **)*puVar1)(puVar1,defaultparam);
          puVar1[1] = uVar3;
        }
        pPVar4 = (PClass *)puVar1[1];
        bVar8 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar8) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar8 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar8) {
          pcVar5 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004578fa;
        }
      }
      if (2 < numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if (numparam == 3) {
            pcVar5 = "(paramnum) < numparam";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') {
              pos = param[3].field_0.i;
              if (puVar1[1] == 0) {
                uVar3 = (**(code **)*puVar1)(puVar1);
                puVar1[1] = uVar3;
              }
              iVar6 = 0;
              val = FStateLabelStorage::GetState(&StateLabels,pos,(PClassActor *)puVar1[1],false);
              if (0 < numret) {
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_states.cpp"
                                ,0x15e,
                                "int AF_AActor_ResolveState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                VMReturn::SetPointer(ret,val,0);
                iVar6 = 1;
              }
              return iVar6;
            }
            pcVar5 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_states.cpp"
                        ,0x15d,
                        "int AF_AActor_ResolveState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar5 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_004578fa;
      }
    }
  }
  pcVar5 = "(paramnum) < numparam";
LAB_004578fa:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_states.cpp"
                ,0x15c,
                "int AF_AActor_ResolveState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, ResolveState)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_STATE_ACTION(newstate);
	ACTION_RETURN_STATE(newstate);
}